

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O3

vector<chromosome_inf,_std::allocator<chromosome_inf>_> *
get_reference_inf(vector<chromosome_inf,_std::allocator<chromosome_inf>_> *__return_storage_ptr__,
                 string *reference)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  long *plVar4;
  char *__s;
  size_t sVar5;
  pointer pbVar6;
  char local_6b8 [8];
  char buffer [1024];
  long local_2b0;
  ifstream ref_index_handle;
  byte abStack_290 [488];
  long *plStack_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  chromosome_inf tmpinf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmpinf._48_8_ = __return_storage_ptr__;
  memset(local_6b8,0,0x400);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".fai","");
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_50,0,(char *)0x0,(ulong)(reference->_M_dataplus)._M_p);
  psVar1 = &tmpinf.chromosome._M_string_length;
  pbVar6 = (pointer)(plVar4 + 2);
  if ((pointer)*plVar4 == pbVar6) {
    tmpinf.chromosome._M_string_length = (size_type)(pbVar6->_M_dataplus)._M_p;
    tmpinf.chromosome.field_2._M_allocated_capacity = plVar4[3];
    res.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar1;
  }
  else {
    tmpinf.chromosome._M_string_length = (size_type)(pbVar6->_M_dataplus)._M_p;
    res.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
  }
  tmpinf.chromosome._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)pbVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::ifstream::ifstream
            (&local_2b0,
             (string *)
             &res.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_in);
  if (res.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar1) {
    operator_delete(res.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    tmpinf.chromosome._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cVar3 = std::__basic_file<char>::is_open();
  if ((cVar3 != '\0') && ((abStack_290[*(long *)(local_2b0 + -0x18)] & 2) == 0)) {
    do {
      res.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&tmpinf.chromosome._M_string_length;
      tmpinf.chromosome._M_dataplus._M_p = (pointer)0x0;
      tmpinf.chromosome._M_string_length = tmpinf.chromosome._M_string_length & 0xffffffffffffff00;
      std::ios::widen((char)*(undefined8 *)(local_2b0 + -0x18) + (char)&local_2b0);
      std::istream::getline((char *)&local_2b0,(long)local_6b8,'\0');
      paVar2 = &local_50.field_2;
      if (local_6b8[0] != '\0') {
        plStack_a8 = (long *)0x0;
        res.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        res.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __s = strtok(local_6b8,"\t");
        while (local_50._M_dataplus._M_p = (pointer)paVar2, __s != (char *)0x0) {
          sVar5 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &plStack_a8,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          __s = strtok((char *)0x0,"\t");
        }
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,*plStack_a8,plStack_a8[1] + *plStack_a8);
        std::__cxx11::string::operator=
                  ((string *)
                   &res.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        tmpinf.chromosome.field_2._8_8_ = strtoull((char *)plStack_a8[4],(char **)0x0,10);
        tmpinf.len = strtoull((char *)plStack_a8[8],(char **)0x0,10);
        plVar4 = plStack_a8;
        tmpinf.start_offset._0_4_ = atoi((char *)plStack_a8[0xc]);
        tmpinf.start_offset._4_4_ = atoi((char *)plVar4[0x10]);
        std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::push_back
                  ((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)tmpinf._48_8_,
                   (value_type *)
                   &res.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&plStack_a8);
      }
      if (res.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pointer)&tmpinf.chromosome._M_string_length) {
        operator_delete(res.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        tmpinf.chromosome._M_string_length + 1);
      }
    } while ((abStack_290[*(long *)(local_2b0 + -0x18)] & 2) == 0);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_2b0);
  return (vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)tmpinf._48_8_;
}

Assistant:

vector<chromosome_inf> get_reference_inf(string reference){
    //2021-6-16 13:02:45
    vector<struct chromosome_inf> ref_inf;
    char buffer[1024]{0};
    // cout << reference+ string(".fai")<<endl;

    ifstream ref_index_handle (reference + string(".fai")); 
    if (ref_index_handle.is_open()){
        while (! ref_index_handle.eof() )
        {
            struct chromosome_inf tmpinf;

            ref_index_handle.getline (buffer,1024);  //读入每行
            if ( strlen(buffer) == 0 ){
                continue;
            }
            
            // C type string split 
            vector<string> res;
            char* temp = strtok(buffer, "\t");
            while(temp != NULL)
            {
                res.push_back(string(temp));
                temp = strtok(NULL, "\t");
            }

            tmpinf.chromosome = string(res[0]);
            tmpinf.len = strtoull( res[1].c_str(), NULL,10 );
            tmpinf.start_offset = strtoull( res[2].c_str(), NULL,10 );
            tmpinf.line_bases = atoi( res[3].c_str() );
            tmpinf.line_width = atoi( res[4].c_str() );

            ref_inf.push_back(tmpinf);

            // cout<< tmpinf.chromosome <<endl;
            // cout<< tmpinf.len <<endl;
            // cout<< tmpinf.start_offset <<endl;
            // cout<< tmpinf.line_bases <<endl;
            // cout<< tmpinf.line_width <<endl;
            
        }
    }
    
    ref_index_handle.close();


    return ref_inf;
}